

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

idx_t duckdb::DBConfig::GetSystemAvailableMemory(FileSystem *fs)

{
  char *pcVar1;
  char *pcVar2;
  optional_idx oVar3;
  idx_t iVar4;
  idx_t iVar5;
  optional_idx *this;
  optional_idx cgroup_memory_limit;
  optional_idx memory;
  optional_idx local_508;
  optional_idx local_500;
  DBConfigOptions local_4f8;
  
  pcVar1 = getenv("SLURM_MEM_PER_NODE");
  pcVar2 = getenv("SLURM_MEM_PER_CPU");
  if (pcVar1 == (char *)0x0) {
    if (pcVar2 != (char *)0x0) {
      ::std::__cxx11::string::string((string *)&local_4f8,pcVar2,(allocator *)&local_500);
      oVar3 = ParseMemoryLimitSlurm(&local_4f8.database_path);
      local_508 = oVar3;
      ::std::__cxx11::string::~string((string *)&local_4f8);
      if (oVar3.index != 0xffffffffffffffff) {
        iVar5 = GetSystemMaxThreads(fs);
        iVar4 = optional_idx::GetIndex(&local_508);
        return iVar4 * iVar5;
      }
    }
  }
  else {
    ::std::__cxx11::string::string((string *)&local_4f8,pcVar1,(allocator *)&local_500);
    oVar3 = ParseMemoryLimitSlurm(&local_4f8.database_path);
    local_508 = oVar3;
    ::std::__cxx11::string::~string((string *)&local_4f8);
    this = &local_508;
    if (oVar3.index != 0xffffffffffffffff) goto LAB_01467b59;
  }
  local_508 = CGroups::GetMemoryLimit(fs);
  this = &local_508;
  if (local_508.index == 0xffffffffffffffff) {
    local_500 = FileSystem::GetAvailableMemory();
    if (local_500.index == 0xffffffffffffffff) {
      switchD_014c3389::default(&local_4f8,0,0x4e8);
      DBConfigOptions::DBConfigOptions(&local_4f8);
      DBConfigOptions::~DBConfigOptions(&local_4f8);
      return local_4f8.maximum_memory;
    }
    this = &local_500;
  }
LAB_01467b59:
  iVar5 = optional_idx::GetIndex(this);
  return iVar5;
}

Assistant:

idx_t DBConfig::GetSystemAvailableMemory(FileSystem &fs) {
#ifdef __linux__
	// Check SLURM environment variables first
	const char *slurm_mem_per_node = getenv("SLURM_MEM_PER_NODE");
	const char *slurm_mem_per_cpu = getenv("SLURM_MEM_PER_CPU");

	if (slurm_mem_per_node) {
		auto limit = ParseMemoryLimitSlurm(slurm_mem_per_node);
		if (limit.IsValid()) {
			return limit.GetIndex();
		}
	} else if (slurm_mem_per_cpu) {
		auto mem_per_cpu = ParseMemoryLimitSlurm(slurm_mem_per_cpu);
		if (mem_per_cpu.IsValid()) {
			idx_t num_threads = GetSystemMaxThreads(fs);
			return mem_per_cpu.GetIndex() * num_threads;
		}
	}

	// Check cgroup memory limit
	auto cgroup_memory_limit = CGroups::GetMemoryLimit(fs);
	if (cgroup_memory_limit.IsValid()) {
		return cgroup_memory_limit.GetIndex();
	}
#endif

	// System memory detection
	auto memory = FileSystem::GetAvailableMemory();
	if (!memory.IsValid()) {
		return DBConfigOptions().maximum_memory;
	}
	return memory.GetIndex();
}